

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::timestamp_t,duckdb::date_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool,true,false>
               (string_t *ldata,timestamp_t *rdata,date_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  date_t dVar3;
  ulong uVar4;
  ulong uVar5;
  timestamp_t tVar6;
  idx_t i;
  ulong uVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  string_t specifier;
  string_t specifier_00;
  string_t specifier_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    tVar6.value = count;
    for (iVar8 = 0; count != iVar8; iVar8 = iVar8 + 1) {
      specifier_01.value.pointer.ptr = (char *)rdata[iVar8].value;
      specifier_01.value._0_8_ = (ldata->value).pointer.ptr;
      dVar3 = DateTruncBinaryOperator::
              Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::date_t>
                        (*(DateTruncBinaryOperator **)&ldata->value,specifier_01,tVar6);
      result_data[iVar8].days = dVar3.days;
    }
  }
  else {
    uVar9 = 0;
    for (uVar5 = 0; uVar5 != count + 0x3f >> 6; uVar5 = uVar5 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      tVar6.value = uVar5;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar7 = count;
        }
LAB_0069f441:
        for (; uVar4 = uVar9, uVar9 < uVar7; uVar9 = uVar9 + 1) {
          specifier.value.pointer.ptr = (char *)rdata[uVar9].value;
          specifier.value._0_8_ = (ldata->value).pointer.ptr;
          dVar3 = DateTruncBinaryOperator::
                  Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::date_t>
                            (*(DateTruncBinaryOperator **)&ldata->value,specifier,tVar6);
          result_data[uVar9].days = dVar3.days;
        }
      }
      else {
        uVar2 = puVar1[uVar5];
        uVar7 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar7 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_0069f441;
        uVar4 = uVar7;
        if (uVar2 != 0) {
          for (uVar10 = 0; uVar4 = uVar10 + uVar9, uVar10 + uVar9 < uVar7; uVar10 = uVar10 + 1) {
            if ((uVar2 >> (uVar10 & 0x3f) & 1) != 0) {
              specifier_00.value.pointer.ptr = (char *)rdata[uVar9 + uVar10].value;
              specifier_00.value._0_8_ = (ldata->value).pointer.ptr;
              dVar3 = DateTruncBinaryOperator::
                      Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::date_t>
                                (*(DateTruncBinaryOperator **)&ldata->value,specifier_00,tVar6);
              (result_data + uVar9)[uVar10].days = dVar3.days;
              tVar6.value = (int64_t)(result_data + uVar9);
            }
          }
        }
      }
      uVar9 = uVar4;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}